

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_impl_glfw.cpp
# Opt level: O0

bool ImGui_ImplGlfw_Init(GLFWwindow *window,bool install_callbacks,GlfwClientApi client_api)

{
  ImGuiIO *handle;
  ImGuiViewport *pIVar1;
  GlfwClientApi in_EDX;
  byte in_SIL;
  GLFWwindow *in_RDI;
  ImGuiViewport *main_viewport;
  ImGuiIO *io;
  int in_stack_ffffffffffffffdc;
  GLFWkeyfun in_stack_ffffffffffffffe0;
  
  g_Time = 0.0;
  g_Window = in_RDI;
  handle = ImGui::GetIO();
  handle->BackendFlags = handle->BackendFlags | 2;
  handle->BackendFlags = handle->BackendFlags | 4;
  handle->BackendFlags = handle->BackendFlags | 0x400;
  handle->BackendPlatformName = "imgui_impl_glfw";
  handle->KeyMap[0] = 0x102;
  handle->KeyMap[1] = 0x107;
  handle->KeyMap[2] = 0x106;
  handle->KeyMap[3] = 0x109;
  handle->KeyMap[4] = 0x108;
  handle->KeyMap[5] = 0x10a;
  handle->KeyMap[6] = 0x10b;
  handle->KeyMap[7] = 0x10c;
  handle->KeyMap[8] = 0x10d;
  handle->KeyMap[9] = 0x104;
  handle->KeyMap[10] = 0x105;
  handle->KeyMap[0xb] = 0x103;
  handle->KeyMap[0xc] = 0x20;
  handle->KeyMap[0xd] = 0x101;
  handle->KeyMap[0xe] = 0x100;
  handle->KeyMap[0xf] = 0x14f;
  handle->KeyMap[0x10] = 0x41;
  handle->KeyMap[0x11] = 0x43;
  handle->KeyMap[0x12] = 0x56;
  handle->KeyMap[0x13] = 0x58;
  handle->KeyMap[0x14] = 0x59;
  handle->KeyMap[0x15] = 0x5a;
  handle->SetClipboardTextFn = ImGui_ImplGlfw_SetClipboardText;
  handle->GetClipboardTextFn = ImGui_ImplGlfw_GetClipboardText;
  handle->ClipboardUserData = g_Window;
  g_MouseCursors[0] = glfwCreateStandardCursor(in_stack_ffffffffffffffdc);
  g_MouseCursors[1] = glfwCreateStandardCursor(in_stack_ffffffffffffffdc);
  g_MouseCursors[3] = glfwCreateStandardCursor(in_stack_ffffffffffffffdc);
  g_MouseCursors[4] = glfwCreateStandardCursor(in_stack_ffffffffffffffdc);
  g_MouseCursors[7] = glfwCreateStandardCursor(in_stack_ffffffffffffffdc);
  g_MouseCursors[2] = glfwCreateStandardCursor(in_stack_ffffffffffffffdc);
  g_MouseCursors[5] = glfwCreateStandardCursor(in_stack_ffffffffffffffdc);
  g_MouseCursors[6] = glfwCreateStandardCursor(in_stack_ffffffffffffffdc);
  g_MouseCursors[8] = glfwCreateStandardCursor(in_stack_ffffffffffffffdc);
  g_PrevUserCallbackMousebutton = (GLFWmousebuttonfun)0x0;
  g_PrevUserCallbackScroll = (GLFWscrollfun)0x0;
  g_PrevUserCallbackKey = (GLFWkeyfun)0x0;
  g_PrevUserCallbackChar = (GLFWcharfun)0x0;
  if ((in_SIL & 1) != 0) {
    g_InstalledCallbacks = true;
    g_PrevUserCallbackMousebutton =
         glfwSetMouseButtonCallback
                   ((GLFWwindow *)handle,(GLFWmousebuttonfun)in_stack_ffffffffffffffe0);
    g_PrevUserCallbackScroll =
         glfwSetScrollCallback((GLFWwindow *)handle,(GLFWscrollfun)in_stack_ffffffffffffffe0);
    g_PrevUserCallbackKey = glfwSetKeyCallback((GLFWwindow *)handle,in_stack_ffffffffffffffe0);
    g_PrevUserCallbackChar =
         glfwSetCharCallback((GLFWwindow *)handle,(GLFWcharfun)in_stack_ffffffffffffffe0);
  }
  pIVar1 = ImGui::GetMainViewport();
  pIVar1->PlatformHandle = g_Window;
  if ((handle->ConfigFlags & 0x400U) != 0) {
    ImGui_ImplGlfw_InitPlatformInterface();
  }
  g_ClientApi = in_EDX;
  return true;
}

Assistant:

static bool ImGui_ImplGlfw_Init(GLFWwindow* window, bool install_callbacks, GlfwClientApi client_api)
{
    g_Window = window;
    g_Time = 0.0;

    // Setup back-end capabilities flags
    ImGuiIO& io = ImGui::GetIO();
    io.BackendFlags |= ImGuiBackendFlags_HasMouseCursors;         // We can honor GetMouseCursor() values (optional)
    io.BackendFlags |= ImGuiBackendFlags_HasSetMousePos;          // We can honor io.WantSetMousePos requests (optional, rarely used)
    io.BackendFlags |= ImGuiBackendFlags_PlatformHasViewports;    // We can create multi-viewports on the Platform side (optional)
#if GLFW_HAS_GLFW_HOVERED && defined(_WIN32)
    io.BackendFlags |= ImGuiBackendFlags_HasMouseHoveredViewport; // We can set io.MouseHoveredViewport correctly (optional, not easy)
#endif
    io.BackendPlatformName = "imgui_impl_glfw";

    // Keyboard mapping. ImGui will use those indices to peek into the io.KeysDown[] array.
    io.KeyMap[ImGuiKey_Tab] = GLFW_KEY_TAB;
    io.KeyMap[ImGuiKey_LeftArrow] = GLFW_KEY_LEFT;
    io.KeyMap[ImGuiKey_RightArrow] = GLFW_KEY_RIGHT;
    io.KeyMap[ImGuiKey_UpArrow] = GLFW_KEY_UP;
    io.KeyMap[ImGuiKey_DownArrow] = GLFW_KEY_DOWN;
    io.KeyMap[ImGuiKey_PageUp] = GLFW_KEY_PAGE_UP;
    io.KeyMap[ImGuiKey_PageDown] = GLFW_KEY_PAGE_DOWN;
    io.KeyMap[ImGuiKey_Home] = GLFW_KEY_HOME;
    io.KeyMap[ImGuiKey_End] = GLFW_KEY_END;
    io.KeyMap[ImGuiKey_Insert] = GLFW_KEY_INSERT;
    io.KeyMap[ImGuiKey_Delete] = GLFW_KEY_DELETE;
    io.KeyMap[ImGuiKey_Backspace] = GLFW_KEY_BACKSPACE;
    io.KeyMap[ImGuiKey_Space] = GLFW_KEY_SPACE;
    io.KeyMap[ImGuiKey_Enter] = GLFW_KEY_ENTER;
    io.KeyMap[ImGuiKey_Escape] = GLFW_KEY_ESCAPE;
    io.KeyMap[ImGuiKey_KeyPadEnter] = GLFW_KEY_KP_ENTER;
    io.KeyMap[ImGuiKey_A] = GLFW_KEY_A;
    io.KeyMap[ImGuiKey_C] = GLFW_KEY_C;
    io.KeyMap[ImGuiKey_V] = GLFW_KEY_V;
    io.KeyMap[ImGuiKey_X] = GLFW_KEY_X;
    io.KeyMap[ImGuiKey_Y] = GLFW_KEY_Y;
    io.KeyMap[ImGuiKey_Z] = GLFW_KEY_Z;

    io.SetClipboardTextFn = ImGui_ImplGlfw_SetClipboardText;
    io.GetClipboardTextFn = ImGui_ImplGlfw_GetClipboardText;
    io.ClipboardUserData = g_Window;

    g_MouseCursors[ImGuiMouseCursor_Arrow] = glfwCreateStandardCursor(GLFW_ARROW_CURSOR);
    g_MouseCursors[ImGuiMouseCursor_TextInput] = glfwCreateStandardCursor(GLFW_IBEAM_CURSOR);
    g_MouseCursors[ImGuiMouseCursor_ResizeNS] = glfwCreateStandardCursor(GLFW_VRESIZE_CURSOR);
    g_MouseCursors[ImGuiMouseCursor_ResizeEW] = glfwCreateStandardCursor(GLFW_HRESIZE_CURSOR);
    g_MouseCursors[ImGuiMouseCursor_Hand] = glfwCreateStandardCursor(GLFW_HAND_CURSOR);
#if GLFW_HAS_NEW_CURSORS
    g_MouseCursors[ImGuiMouseCursor_ResizeAll] = glfwCreateStandardCursor(GLFW_RESIZE_ALL_CURSOR);
    g_MouseCursors[ImGuiMouseCursor_ResizeNESW] = glfwCreateStandardCursor(GLFW_RESIZE_NESW_CURSOR);
    g_MouseCursors[ImGuiMouseCursor_ResizeNWSE] = glfwCreateStandardCursor(GLFW_RESIZE_NWSE_CURSOR);
    g_MouseCursors[ImGuiMouseCursor_NotAllowed] = glfwCreateStandardCursor(GLFW_NOT_ALLOWED_CURSOR);
#else
    g_MouseCursors[ImGuiMouseCursor_ResizeAll] = glfwCreateStandardCursor(GLFW_ARROW_CURSOR);
    g_MouseCursors[ImGuiMouseCursor_ResizeNESW] = glfwCreateStandardCursor(GLFW_ARROW_CURSOR);
    g_MouseCursors[ImGuiMouseCursor_ResizeNWSE] = glfwCreateStandardCursor(GLFW_ARROW_CURSOR);
    g_MouseCursors[ImGuiMouseCursor_NotAllowed] = glfwCreateStandardCursor(GLFW_ARROW_CURSOR);
#endif

    // Chain GLFW callbacks: our callbacks will call the user's previously installed callbacks, if any.
    g_PrevUserCallbackMousebutton = NULL;
    g_PrevUserCallbackScroll = NULL;
    g_PrevUserCallbackKey = NULL;
    g_PrevUserCallbackChar = NULL;
    if (install_callbacks)
    {
        g_InstalledCallbacks = true;
        g_PrevUserCallbackMousebutton = glfwSetMouseButtonCallback(window, ImGui_ImplGlfw_MouseButtonCallback);
        g_PrevUserCallbackScroll = glfwSetScrollCallback(window, ImGui_ImplGlfw_ScrollCallback);
        g_PrevUserCallbackKey = glfwSetKeyCallback(window, ImGui_ImplGlfw_KeyCallback);
        g_PrevUserCallbackChar = glfwSetCharCallback(window, ImGui_ImplGlfw_CharCallback);
    }

    // Our mouse update function expect PlatformHandle to be filled for the main viewport
    ImGuiViewport* main_viewport = ImGui::GetMainViewport();
    main_viewport->PlatformHandle = (void*)g_Window;
#ifdef _WIN32
    main_viewport->PlatformHandleRaw = glfwGetWin32Window(g_Window);
#endif
    if (io.ConfigFlags & ImGuiConfigFlags_ViewportsEnable)
        ImGui_ImplGlfw_InitPlatformInterface();

    g_ClientApi = client_api;
    return true;
}